

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

bool __thiscall re2::Regexp::ParseState::ParsePerlFlags(ParseState *this,StringPiece *s)

{
  char *pcVar1;
  RegexpStatus *pRVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  ParseFlags PVar8;
  bool bVar9;
  int iVar10;
  StringPiece t;
  Rune c;
  StringPiece local_1c8;
  LogMessage local_1b0;
  
  local_1c8.ptr_ = s->ptr_;
  uVar3._0_4_ = s->length_;
  uVar3._4_4_ = *(undefined4 *)&s->field_0xc;
  PVar8 = this->flags_;
  if (((((PVar8 >> 9 & 1) == 0) || ((int)uVar3 < 2)) || (*local_1c8.ptr_ != '(')) ||
     (local_1c8.ptr_[1] != '?')) {
    local_1c8._8_8_ = uVar3;
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/parse.cc",0x776
               ,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1b0 + 8),"Bad call to ParseState::ParsePerlFlags",0x26);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    this->status_->code_ = kRegexpInternalError;
  }
  else {
    pcVar1 = local_1c8.ptr_ + 2;
    local_1c8._12_4_ = uVar3._4_4_;
    local_1c8.length_ = (int)uVar3 + -2;
    if ((((int)uVar3 < 5) || (*pcVar1 != 'P')) || (local_1c8.ptr_[3] != '<')) {
      bVar9 = false;
      bVar4 = false;
      bVar5 = false;
      iVar10 = 4;
      local_1c8.ptr_ = pcVar1;
      do {
        if (local_1c8.length_ == 0) goto LAB_0012f5e5;
        iVar6 = StringPieceToRune(&local_1b0.severity_,&local_1c8,this->status_);
        if (iVar6 < 0) {
          iVar10 = 1;
          goto LAB_0012f5e5;
        }
        if (local_1b0.severity_ < 0x55) {
          if (local_1b0.severity_ != 0x29) {
            if (local_1b0.severity_ == 0x2d) {
              if (!bVar5) {
                bVar5 = true;
                bVar4 = false;
                goto LAB_0012f5cd;
              }
              goto LAB_0012f5e5;
            }
            if (local_1b0.severity_ != 0x3a) goto LAB_0012f5e5;
            DoLeftParenNoCapture(this);
          }
          bVar9 = true;
        }
        else {
          if (local_1b0.severity_ < 0x6d) {
            if (local_1b0.severity_ == 0x55) {
              if (bVar5) {
                PVar8 = PVar8 & ~NonGreedy;
              }
              else {
                PVar8 = PVar8 | NonGreedy;
              }
            }
            else {
              if (local_1b0.severity_ != 0x69) goto LAB_0012f5e5;
              if (bVar5) {
                PVar8 = PVar8 & ~FoldCase;
              }
              else {
                PVar8 = PVar8 | FoldCase;
              }
            }
          }
          else if (local_1b0.severity_ == 0x6d) {
            if (bVar5) {
              PVar8 = PVar8 | OneLine;
            }
            else {
              PVar8 = PVar8 & ~OneLine;
            }
          }
          else {
            if (local_1b0.severity_ != 0x73) goto LAB_0012f5e5;
            if (bVar5) {
              PVar8 = PVar8 & ~DotNL;
            }
            else {
              PVar8 = PVar8 | DotNL;
            }
          }
          bVar4 = true;
        }
LAB_0012f5cd:
      } while (!bVar9);
      iVar10 = 2;
LAB_0012f5e5:
      if (iVar10 != 4) {
        if (iVar10 != 2) {
          return false;
        }
        if ((!bVar5) || (bVar4)) {
          this->flags_ = PVar8;
          s->length_ = local_1c8.length_;
          s->ptr_ = local_1c8.ptr_;
          return true;
        }
      }
      pRVar2 = this->status_;
      pRVar2->code_ = kRegexpBadPerlOp;
      pcVar1 = s->ptr_;
      (pRVar2->error_arg_).ptr_ = pcVar1;
      (pRVar2->error_arg_).length_ = (int)local_1c8.ptr_ - (int)pcVar1;
    }
    else {
      local_1c8.ptr_ = pcVar1;
      sVar7 = StringPiece::find(&local_1c8,'>',2);
      pcVar1 = local_1c8.ptr_;
      if (sVar7 == 0xffffffffffffffff) {
        bVar5 = IsValidUTF8(s,this->status_);
        if (bVar5) {
          pRVar2 = this->status_;
          pRVar2->code_ = kRegexpBadNamedCapture;
          (pRVar2->error_arg_).ptr_ = s->ptr_;
          (pRVar2->error_arg_).length_ = s->length_;
        }
      }
      else {
        local_1b0._0_8_ = local_1c8.ptr_ + 2;
        local_1b0._8_4_ = (int)sVar7 + -2;
        bVar5 = IsValidUTF8((StringPiece *)&local_1b0,this->status_);
        if (bVar5) {
          iVar10 = (int)sVar7 + 3;
          bVar5 = IsValidCaptureName((StringPiece *)&local_1b0);
          if (bVar5) {
            DoLeftParen(this,(StringPiece *)&local_1b0);
            iVar10 = ((int)(pcVar1 + -2) + iVar10) - (int)s->ptr_;
            s->ptr_ = s->ptr_ + iVar10;
            s->length_ = s->length_ - iVar10;
            return true;
          }
          pRVar2 = this->status_;
          pRVar2->code_ = kRegexpBadNamedCapture;
          (pRVar2->error_arg_).ptr_ = pcVar1 + -2;
          (pRVar2->error_arg_).length_ = iVar10;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Regexp::ParseState::ParsePerlFlags(StringPiece* s) {
  StringPiece t = *s;

  // Caller is supposed to check this.
  if (!(flags_ & PerlX) || t.size() < 2 || t[0] != '(' || t[1] != '?') {
    LOG(DFATAL) << "Bad call to ParseState::ParsePerlFlags";
    status_->set_code(kRegexpInternalError);
    return false;
  }

  t.remove_prefix(2);  // "(?"

  // Check for named captures, first introduced in Python's regexp library.
  // As usual, there are three slightly different syntaxes:
  //
  //   (?P<name>expr)   the original, introduced by Python
  //   (?<name>expr)    the .NET alteration, adopted by Perl 5.10
  //   (?'name'expr)    another .NET alteration, adopted by Perl 5.10
  //
  // Perl 5.10 gave in and implemented the Python version too,
  // but they claim that the last two are the preferred forms.
  // PCRE and languages based on it (specifically, PHP and Ruby)
  // support all three as well.  EcmaScript 4 uses only the Python form.
  //
  // In both the open source world (via Code Search) and the
  // Google source tree, (?P<expr>name) is the dominant form,
  // so that's the one we implement.  One is enough.
  if (t.size() > 2 && t[0] == 'P' && t[1] == '<') {
    // Pull out name.
    size_t end = t.find('>', 2);
    if (end == t.npos) {
      if (!IsValidUTF8(*s, status_))
        return false;
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(*s);
      return false;
    }

    // t is "P<name>...", t[end] == '>'
    StringPiece capture(t.begin()-2, static_cast<int>(end)+3);  // "(?P<name>"
    StringPiece name(t.begin()+2, static_cast<int>(end)-2);     // "name"
    if (!IsValidUTF8(name, status_))
      return false;
    if (!IsValidCaptureName(name)) {
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(capture);
      return false;
    }

    if (!DoLeftParen(name)) {
      // DoLeftParen's failure set status_.
      return false;
    }

    s->remove_prefix(static_cast<int>(capture.end() - s->begin()));
    return true;
  }

  bool negated = false;
  bool sawflags = false;
  int nflags = flags_;
  Rune c;
  for (bool done = false; !done; ) {
    if (t.size() == 0)
      goto BadPerlOp;
    if (StringPieceToRune(&c, &t, status_) < 0)
      return false;
    switch (c) {
      default:
        goto BadPerlOp;

      // Parse flags.
      case 'i':
        sawflags = true;
        if (negated)
          nflags &= ~FoldCase;
        else
          nflags |= FoldCase;
        break;

      case 'm':  // opposite of our OneLine
        sawflags = true;
        if (negated)
          nflags |= OneLine;
        else
          nflags &= ~OneLine;
        break;

      case 's':
        sawflags = true;
        if (negated)
          nflags &= ~DotNL;
        else
          nflags |= DotNL;
        break;

      case 'U':
        sawflags = true;
        if (negated)
          nflags &= ~NonGreedy;
        else
          nflags |= NonGreedy;
        break;

      // Negation
      case '-':
        if (negated)
          goto BadPerlOp;
        negated = true;
        sawflags = false;
        break;

      // Open new group.
      case ':':
        if (!DoLeftParenNoCapture()) {
          // DoLeftParenNoCapture's failure set status_.
          return false;
        }
        done = true;
        break;

      // Finish flags.
      case ')':
        done = true;
        break;
    }
  }

  if (negated && !sawflags)
    goto BadPerlOp;

  flags_ = static_cast<Regexp::ParseFlags>(nflags);
  *s = t;
  return true;

BadPerlOp:
  status_->set_code(kRegexpBadPerlOp);
  status_->set_error_arg(
      StringPiece(s->begin(), static_cast<int>(t.begin() - s->begin())));
  return false;
}